

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O2

void * phmap::priv::
       Allocate<8ul,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>>
                 (PropagatingCountingAlloc<std::pair<const_int,_int>_> *alloc,size_t n)

{
  long *plVar1;
  void *pvVar2;
  ulong uVar3;
  
  if (n == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0x105d,
                  "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>]"
                 );
  }
  plVar1 = (alloc->super_CountingAllocator<std::pair<const_int,_int>_>).bytes_used_;
  if (plVar1 == (long *)0x0) {
    __assert_fail("bytes_used_ != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.h"
                  ,0x1c8,
                  "pointer phmap::priv::CountingAllocator<M>::allocate(size_type, std::allocator_traits<std::allocator<void>>::const_pointer) [T = M]"
                 );
  }
  uVar3 = n + 7 & 0xfffffffffffffff8;
  *plVar1 = *plVar1 + uVar3;
  if ((long)(n + 7) < 0) {
    std::__throw_bad_alloc();
  }
  pvVar2 = operator_new(uVar3);
  if (((ulong)pvVar2 & 7) == 0) {
    return pvVar2;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % Alignment == 0 && \"allocator does not respect alignment\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0x1064,
                "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>]"
               );
}

Assistant:

void* Allocate(Alloc* alloc, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  struct alignas(Alignment) M {};
  using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
  A mem_alloc(*alloc);
  void* p = &*AT::allocate(mem_alloc, (n + sizeof(M) - 1) / sizeof(M)); // `&*` to support custom pointers such as boost offset_ptr.
  assert(reinterpret_cast<uintptr_t>(p) % Alignment == 0 &&
         "allocator does not respect alignment");
  return p;
}